

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator_mq.c
# Opt level: O3

mqd_t validator_mq_start(_Bool server,_Bool *err)

{
  mqd_t mVar1;
  int iVar2;
  undefined7 in_register_00000039;
  undefined1 local_58 [8];
  mq_attr validator_mq_attrs;
  
  if ((int)CONCAT71(in_register_00000039,server) == 0) {
    mVar1 = mq_open("/pw_validator_validator_mq_single",1);
    if (mVar1 != -1) {
      return mVar1;
    }
  }
  else {
    mVar1 = mq_open("/pw_validator_validator_mq_single",0x40,0x1b6,0);
    if (((mVar1 != -1) && (iVar2 = mq_getattr(mVar1,(mq_attr *)local_58), iVar2 != -1)) &&
       (0x3f7 < validator_mq_attrs.mq_maxmsg)) {
      return mVar1;
    }
  }
  if (err != (_Bool *)0x0) {
    *err = true;
  }
  log_formatted("Fail in %s, function: %s",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/validator_mq.c"
                ,"validator_mq_start");
  return -1;
}

Assistant:

mqd_t validator_mq_start(bool server, bool *err) {
    assert(err != NULL);

    int tmp_err = 0;
    mqd_t queue;

    if(server) {
        queue = mq_open(VALIDATOR_MQ_NAME, O_RDONLY | O_CREAT, VALIDATOR_MQ_PERMISSIONS, NULL);
        INT_FAIL_IF(queue == -1);

        // resize queue message size if it is too small
        struct mq_attr validator_mq_attrs;
        tmp_err = mq_getattr(queue, &validator_mq_attrs);
        INT_FAIL_IF(tmp_err == -1);
        INT_FAIL_IF(validator_mq_attrs.mq_msgsize < (int)sizeof(validator_mq_msg));
    } else {
        queue = mq_open(VALIDATOR_MQ_NAME, O_WRONLY);
        INT_FAIL_IF(queue == -1);
    }
    assert(queue != -1);
    return queue;
}